

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O2

span<int,_2UL> __thiscall
nonstd::span_lite::span<int,18446744073709551615ul>::subspan<1ul,2ul>
          (span<int,18446744073709551615ul> *this)

{
  span<int,_2UL> sVar1;
  
  if (*(ulong *)(this + 8) < 3) {
    detail::report_contract_violation
              (
              "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1181: Precondition violation."
              );
  }
  sVar1.data_ = (pointer)(*(long *)this + 4);
  sVar1.size_ = 2;
  return sVar1;
}

Assistant:

span_constexpr_exp span< element_type, Count >
    subspan() const
    {
        span_EXPECTS(
            ( detail::is_positive( Offset ) && Offset <= size() ) &&
            ( Count == dynamic_extent || (detail::is_positive( Count ) && Count + Offset <= size()) )
        );

        return span< element_type, Count >(
            data() + Offset, Count != dynamic_extent ? Count : (Extent != dynamic_extent ? Extent - Offset : size() - Offset) );
    }